

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupTopAnd_iter(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Vec_Int_t *__ptr;
  int *piVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar6;
  Gia_Man_t *pGVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  Vec_Int_t *p_01;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  size_t __size;
  bool bVar17;
  bool bVar18;
  
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 1000;
  __ptr->nSize = 0;
  piVar5 = (int *)malloc(4000);
  __ptr->pArray = piVar5;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    lVar16 = 0;
    do {
      iVar9 = pVVar6->pArray[lVar16];
      if (((long)iVar9 < 0) || (iVar2 = p->nObjs, iVar2 <= iVar9)) goto LAB_001e7e29;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar9;
      uVar15 = (uint)*(undefined8 *)pGVar1;
      if ((~*(ulong *)(pGVar1 + -(ulong)(uVar15 & 0x1fffffff)) & 0x1fffffff1fffffff) != 0) {
        if ((uVar15 >> 0x1d & 1) == 0) {
          if (iVar2 <= iVar9) goto LAB_001e7e48;
          iVar9 = iVar9 - (uVar15 & 0x1fffffff);
          pVVar6 = __ptr;
        }
        else {
          if (iVar2 <= iVar9) goto LAB_001e7e48;
          iVar9 = iVar9 - (uVar15 & 0x1fffffff);
          if (iVar9 < 0) goto LAB_001e7e86;
          iVar9 = iVar9 * 2 + 1;
          pVVar6 = p_00;
        }
        Vec_IntPush(pVVar6,iVar9);
      }
      lVar16 = lVar16 + 1;
      pVVar6 = p->vCos;
    } while (lVar16 < pVVar6->nSize);
  }
  if (__ptr->nSize == 0) {
    if (fVerbose != 0) {
      puts("The AIG cannot be decomposed using AND-decomposition.");
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
  }
  else {
    if (0 < __ptr->nSize) {
      lVar16 = 0;
      do {
        iVar9 = __ptr->pArray[lVar16];
        if (((long)iVar9 < 0) || (iVar2 = p->nObjs, iVar2 <= iVar9)) goto LAB_001e7e29;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar1 = p->pObjs + iVar9;
        uVar15 = (uint)*(ulong *)pGVar1;
        pVVar6 = p_00;
        if ((uVar15 & 0x9fffffff) == 0x9fffffff) {
          if (iVar2 <= iVar9) goto LAB_001e7e48;
          iVar9 = iVar9 * 2;
        }
        else {
          if (((int)uVar15 < 0) || ((uVar15 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                          ,0xa18,"Gia_Man_t *Gia_ManDupTopAnd_iter(Gia_Man_t *, int)");
          }
          if ((uVar15 >> 0x1d & 1) == 0) {
            if (iVar2 <= iVar9) goto LAB_001e7e48;
            iVar9 = iVar9 - (uVar15 & 0x1fffffff);
            p_01 = __ptr;
          }
          else {
            if (iVar2 <= iVar9) {
LAB_001e7e48:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar9 = iVar9 - (uVar15 & 0x1fffffff);
            if (iVar9 < 0) {
LAB_001e7e86:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            iVar9 = iVar9 * 2 + 1;
            p_01 = p_00;
          }
          Vec_IntPush(p_01,iVar9);
          pGVar3 = p->pObjs;
          uVar15 = (uint)(*(ulong *)pGVar1 >> 0x20);
          if ((*(ulong *)pGVar1 >> 0x3d & 1) == 0) {
            if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) goto LAB_001e7e48;
            iVar9 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555 -
                    (uVar15 & 0x1fffffff);
            pVVar6 = __ptr;
          }
          else {
            if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) goto LAB_001e7e48;
            iVar9 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555 -
                    (uVar15 & 0x1fffffff);
            if (iVar9 < 0) goto LAB_001e7e86;
            iVar9 = iVar9 * 2 + 1;
          }
        }
        Vec_IntPush(pVVar6,iVar9);
        lVar16 = lVar16 + 1;
      } while (lVar16 < __ptr->nSize);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
    iVar9 = p->nObjs;
    __size = (size_t)iVar9;
    piVar5 = (int *)malloc(__size * 4);
    memset(piVar5,0xff,__size * 4);
    __ptr = (Vec_Int_t *)malloc(__size);
    memset(__ptr,0xff,__size);
    uVar8 = (ulong)p_00->nSize;
    bVar17 = 0 < (long)uVar8;
    if ((long)uVar8 < 1) {
      uVar15 = 0;
    }
    else {
      piVar4 = p_00->pArray;
      uVar15 = 0;
      uVar11 = 1;
      do {
        uVar10 = piVar4[uVar11 - 1];
        if ((int)uVar10 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar12 = (ulong)(uVar10 >> 1);
        if (iVar9 <= (int)(uVar10 >> 1)) {
LAB_001e7e29:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (((uint)*(undefined8 *)(p->pObjs + uVar12) & 0x9fffffff) == 0x9fffffff) {
          piVar5[(uint)((ulong)*(undefined8 *)(p->pObjs + uVar12) >> 0x20) & 0x1fffffff] =
               ~uVar10 & 1;
          uVar15 = uVar15 + 1;
        }
        uVar13 = (uint)*(byte *)((long)&__ptr->nCap + uVar12);
        if (uVar13 < 2) {
          if ((uVar10 & 1) != uVar13) break;
        }
        else {
          *(byte *)((long)&__ptr->nCap + uVar12) = (byte)uVar10 & 1;
        }
        bVar17 = uVar11 < uVar8;
        bVar18 = uVar11 != uVar8;
        uVar11 = uVar11 + 1;
      } while (bVar18);
    }
    if (!bVar17) {
      p_00->nSize = 0;
      if (0 < p->nObjs) {
        lVar16 = 0;
        iVar9 = 0;
        lVar14 = 0;
        do {
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (((*(uint *)(&p->pObjs->field_0x0 + lVar16) & 0x9fffffff) != 0x9fffffff) &&
             (uVar10 = (uint)*(byte *)((long)&__ptr->nCap + lVar14), uVar10 < 2)) {
            Vec_IntPush(p_00,uVar10 + iVar9);
          }
          lVar14 = lVar14 + 1;
          iVar9 = iVar9 + 2;
          lVar16 = lVar16 + 0xc;
        } while (lVar14 < p->nObjs);
      }
      if (fVerbose != 0) {
        printf("Detected %6d AND leaves and %6d CI leaves.\n",(ulong)(uint)p_00->nSize,(ulong)uVar15
              );
      }
      if (uVar15 == 0) {
        pGVar7 = Gia_ManDupDfsLitArray(p,p_00);
      }
      else {
        pGVar7 = Gia_ManDupDfsCiMap(p,piVar5,p_00);
      }
      if (piVar5 != (int *)0x0) {
        free(piVar5);
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        free(__ptr);
      }
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      return pGVar7;
    }
    puts("Problem is trivially UNSAT.");
    if (piVar5 != (int *)0x0) {
      free(piVar5);
    }
    if (__ptr == (Vec_Int_t *)0x0) goto LAB_001e7cfa;
  }
  free(__ptr);
LAB_001e7cfa:
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pGVar7 = Gia_ManDupNormalize(p,0);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManDupTopAnd_iter( Gia_Man_t * p, int fVerbose )  
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vFront, * vLeaves;
    int i, iLit, iObjId, nCiLits, * pCi2Lit;
    char * pVar2Val;
    // collect the frontier
    vFront = Vec_IntAlloc( 1000 );
    vLeaves = Vec_IntAlloc( 1000 );
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( Gia_ObjIsConst0( Gia_ObjFanin0(pObj) ) )
            continue;
        if ( Gia_ObjFaninC0(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit0p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId0p(p, pObj) );
    }
    if ( Vec_IntSize(vFront) == 0 )
    {
        if ( fVerbose )
            printf( "The AIG cannot be decomposed using AND-decomposition.\n" );
        Vec_IntFree( vFront );
        Vec_IntFree( vLeaves );
        return Gia_ManDupNormalize( p, 0 );
    }
    // expand the frontier
    Gia_ManForEachObjVec( vFront, p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntPush( vLeaves, Abc_Var2Lit( Gia_ObjId(p, pObj), 0 ) );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        if ( Gia_ObjFaninC0(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit0p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId0p(p, pObj) );
        if ( Gia_ObjFaninC1(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit1p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId1p(p, pObj) );
    }
    Vec_IntFree( vFront );
    // sort the literals
    nCiLits = 0;
    pCi2Lit = ABC_FALLOC( int, Gia_ManObjNum(p) );
    pVar2Val = ABC_FALLOC( char, Gia_ManObjNum(p) );
    Vec_IntForEachEntry( vLeaves, iLit, i )
    {
        iObjId = Abc_Lit2Var(iLit);
        pObj = Gia_ManObj(p, iObjId);
        if ( Gia_ObjIsCi(pObj) )
        {
            pCi2Lit[Gia_ObjCioId(pObj)] = !Abc_LitIsCompl(iLit);
            nCiLits++;
        }
        if ( pVar2Val[iObjId] != 0 && pVar2Val[iObjId] != 1 )
            pVar2Val[iObjId] = Abc_LitIsCompl(iLit);
        else if ( pVar2Val[iObjId] != Abc_LitIsCompl(iLit) )
            break;
    }
    if ( i < Vec_IntSize(vLeaves) )
    {
        printf( "Problem is trivially UNSAT.\n" );
        ABC_FREE( pCi2Lit );
        ABC_FREE( pVar2Val );
        Vec_IntFree( vLeaves );
        return Gia_ManDupNormalize( p, 0 );
    }
    // create array of input literals
    Vec_IntClear( vLeaves );
    Gia_ManForEachObj( p, pObj, i )
        if ( !Gia_ObjIsCi(pObj) && (pVar2Val[i] == 0 || pVar2Val[i] == 1) )
            Vec_IntPush( vLeaves, Abc_Var2Lit(i, pVar2Val[i]) );
    if ( fVerbose )
        printf( "Detected %6d AND leaves and %6d CI leaves.\n", Vec_IntSize(vLeaves), nCiLits );
    // create the input map
    if ( nCiLits == 0 )
        pNew = Gia_ManDupDfsLitArray( p, vLeaves );
    else
        pNew = Gia_ManDupDfsCiMap( p, pCi2Lit, vLeaves );
    ABC_FREE( pCi2Lit );
    ABC_FREE( pVar2Val );
    Vec_IntFree( vLeaves );
    return pNew;
}